

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

void Zyx_TestExact(char *pFileName)

{
  undefined8 vInfo_00;
  int iVar1;
  int nWords;
  FILE *__stream;
  char *pcVar2;
  word *pIn1;
  FILE *pFile;
  char Line [1000];
  Vec_Wrd_t *vInfo;
  word pSpec [4];
  word *pImpl;
  int local_20;
  int nNodes;
  int nLutSize;
  int nVars;
  int nStrs;
  int iObj;
  char *pFileName_local;
  
  nLutSize = 0;
  nNodes = -1;
  local_20 = -1;
  pImpl._4_4_ = -1;
  _nStrs = pFileName;
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open input file \"%s\".\n",_nStrs);
  }
  else {
    iVar1 = Zyx_TestGetTruthTablePars
                      (_nStrs,(word *)&vInfo,&nNodes,&local_20,(int *)((long)&pImpl + 4));
    if (iVar1 != 0) {
      if (nNodes < 9) {
        if (local_20 < 7) {
          if (pImpl._4_4_ < 0x11) {
            Line._992_8_ = Zyx_TestCreateTruthTables(nNodes,pImpl._4_4_);
            nVars = nNodes;
            while (pcVar2 = fgets((char *)&pFile,1000,__stream), pcVar2 != (char *)0x0) {
              iVar1 = Zyx_TestReadNode((char *)&pFile,(Vec_Wrd_t *)Line._992_8_,nNodes,local_20,
                                       nVars);
              vInfo_00 = Line._992_8_;
              if (iVar1 == 0) {
                if (nVars != nNodes + pImpl._4_4_) {
                  printf("The number of nodes in the structure is not correct.\n");
                  break;
                }
                nLutSize = nLutSize + 1;
                iVar1 = nVars + -1;
                nWords = Abc_TtWordNum(nNodes);
                pIn1 = Zyx_TestTruth((Vec_Wrd_t *)vInfo_00,iVar1,nWords);
                iVar1 = Abc_TtWordNum(nNodes);
                iVar1 = Abc_TtEqual(pIn1,(word *)&vInfo,iVar1);
                if (iVar1 == 0) {
                  printf("Structure %3d : Verification FAILED.\n",(ulong)(uint)nLutSize);
                  printf("Implementation: ");
                  Dau_DsdPrintFromTruth(pIn1,nNodes);
                  printf("Specification:  ");
                  Dau_DsdPrintFromTruth((word *)&vInfo,nNodes);
                }
                else {
                  printf("Structure %3d : Verification successful.\n",(ulong)(uint)nLutSize);
                }
                nVars = nNodes + -1;
              }
              nVars = nVars + 1;
            }
            Vec_WrdFree((Vec_Wrd_t *)Line._992_8_);
            fclose(__stream);
          }
          else {
            printf("This tester does not support structures with more than 16 inputs.\n");
          }
        }
        else {
          printf("This tester does not support nodes with more than 6 inputs.\n");
        }
      }
      else {
        printf("This tester does not support functions with more than 8 inputs.\n");
      }
    }
  }
  return;
}

Assistant:

void Zyx_TestExact( char * pFileName )
{
    int iObj, nStrs = 0, nVars = -1, nLutSize = -1, nNodes = -1;
    word * pImpl, pSpec[4]; Vec_Wrd_t * vInfo; char Line[1000];
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file \"%s\".\n", pFileName );
        return;
    }
    if ( !Zyx_TestGetTruthTablePars( pFileName, pSpec, &nVars, &nLutSize, &nNodes ) )
        return;
    if ( nVars > 8 )
    {
        printf( "This tester does not support functions with more than 8 inputs.\n" );
        return;
    }
    if ( nLutSize > 6 )
    {
        printf( "This tester does not support nodes with more than 6 inputs.\n" );
        return;
    }
    if ( nNodes > 16 )
    {
        printf( "This tester does not support structures with more than 16 inputs.\n" );
        return;
    }
    vInfo = Zyx_TestCreateTruthTables( nVars, nNodes );
    for ( iObj = nVars; fgets(Line, 1000, pFile) != NULL; iObj++ )
    {
        if ( Zyx_TestReadNode( Line, vInfo, nVars, nLutSize, iObj ) )
            continue;
        if ( iObj != nVars + nNodes )
        {
            printf( "The number of nodes in the structure is not correct.\n" );
            break;
        }
        nStrs++;
        pImpl = Zyx_TestTruth( vInfo, iObj-1, Abc_TtWordNum(nVars) );
        if ( Abc_TtEqual( pImpl, pSpec, Abc_TtWordNum(nVars) ) )
            printf( "Structure %3d : Verification successful.\n", nStrs );
        else
        {
            printf( "Structure %3d : Verification FAILED.\n", nStrs );
            printf( "Implementation: " ); Dau_DsdPrintFromTruth( pImpl, nVars );
            printf( "Specification:  " ); Dau_DsdPrintFromTruth( pSpec, nVars );
        }
        iObj = nVars - 1;
    }
    Vec_WrdFree( vInfo );
    fclose( pFile );
}